

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void CVmBifTADS::restore(uint argc)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  err_id_t error_code;
  undefined4 extraout_var;
  undefined8 *puVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  CVmFile *fp;
  long *plVar7;
  int __fd;
  vm_rcdesc *this;
  vm_val_t *__file;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  CVmNetFile *nf;
  
  CVmBif::check_argc(argc,1);
  __file = sp_ + -1;
  this = &rc;
  vm_rcdesc::init(this,(EVP_PKEY_CTX *)"restoreGame");
  iVar3 = CVmNetFile::open((char *)__file,(int)this,1,0xf,"application/x-t3vm-state");
  __fd = (int)this;
  nf = (CVmNetFile *)CONCAT44(extraout_var,iVar3);
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar4;
  uVar5 = _ZTW11G_err_frame();
  *(err_frame_t **)uVar5 = &err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    CVmObjFile::check_safety_for_open(nf,1);
    __fd = 0x2808cf;
    pFVar6 = fopen(nf->lclfname,"rb");
    if (pFVar6 == (FILE *)0x0) {
      err_throw(0x67);
    }
    fp = (CVmFile *)operator_new(0x10);
    fp->fp_ = (osfildef *)pFVar6;
    fp->seek_base_ = 0;
    error_code = CVmSaveFile::restore(fp);
    if (error_code != 0) {
      err_throw(error_code);
    }
  }
  else {
    fp = (CVmFile *)0x0;
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    if (fp != (CVmFile *)0x0) {
      CVmFile::~CVmFile(fp);
      __fd = 0x10;
      operator_delete(fp,0x10);
    }
    if (nf != (CVmNetFile *)0x0) {
      CVmNetFile::close(nf,__fd);
    }
  }
  peVar1 = err_cur__.prv_;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar4 & 2) != 0) {
      plVar7 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar7 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar7 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar7 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  sp_ = sp_ + -(long)(int)argc;
  CVmBif::retval_nil();
  return;
}

Assistant:

check_argc(vmg_ argc, 1);

    /* get the filename or spec */
    const vm_val_t *filespec = G_stk->get(0);

    /* set up for network storage server access, if applicable */
    vm_rcdesc rc(vmg_ "restoreGame", bif_table, 16, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmNetFile::open(
        vmg_ filespec, &rc, NETF_READ, OSFTT3SAV, "application/x-t3vm-state");

    /* open the file and restore the game */
    CVmFile *file = 0;
    int err = 0;
    err_try
    {
        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ netfile, VMOBJFILE_ACCESS_READ);

        /* open the file */
        osfildef *fp = osfoprb(netfile->lclfname, OSFTT3SAV);
        if (fp == 0)
            err_throw(VMERR_FILE_NOT_FOUND);

        /* set up the file reader */
        file = new CVmFile(fp, 0);

        /* restore the state; throw an exception on error */
        if ((err = CVmSaveFile::restore(vmg_ file)) != 0)
            err_throw(err);
    }
    err_finally
    {
        /* close our local file */
        if (file != 0)
            delete file;

        /* close the network file */
        if (netfile != 0)
            netfile->close(vmg0_);
    }
    err_end;

    /* discard arguments */
    G_stk->discard(argc);

    /* no return value */
    retval_nil(vmg0_);
}

/*
 *   restart
 */
void CVmBifTADS::restart(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 0);

    /* reset the VM to the image file's initial state */
    CVmSaveFile::reset(vmg0_);

    /* no return value */
    retval_nil(vmg0_);
}